

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::GetFileNamespace_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  bool bVar1;
  FileOptions *pFVar2;
  string *psVar3;
  FileDescriptor *descriptor_local;
  
  pFVar2 = FileDescriptor::options((FileDescriptor *)this);
  bVar1 = FileOptions::has_csharp_namespace(pFVar2);
  if (bVar1) {
    pFVar2 = FileDescriptor::options((FileDescriptor *)this);
    psVar3 = FileOptions::csharp_namespace_abi_cxx11_(pFVar2);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  }
  else {
    psVar3 = FileDescriptor::package_abi_cxx11_((FileDescriptor *)this);
    UnderscoresToCamelCase(__return_storage_ptr__,psVar3,true,true);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileNamespace(const FileDescriptor* descriptor) {
  if (descriptor->options().has_csharp_namespace()) {
    return descriptor->options().csharp_namespace();
  }
  return UnderscoresToCamelCase(descriptor->package(), true, true);
}